

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx2_gemm.h
# Opt level: O1

void intgemm::AVX2::Kernels8::PrepareBTransposed
               (float *input,int8_t *output,float quant_mult,Index cols,Index rows)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  Index i;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar12 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar14 [64];
  float *local_48 [4];
  float *inputs [4];
  
  if (rows != 0) {
    uVar7 = 0;
    auVar11[8] = 0x81;
    auVar11._0_8_ = 0x8181818181818181;
    auVar11[9] = 0x81;
    auVar11[10] = 0x81;
    auVar11[0xb] = 0x81;
    auVar11[0xc] = 0x81;
    auVar11[0xd] = 0x81;
    auVar11[0xe] = 0x81;
    auVar11[0xf] = 0x81;
    auVar11[0x10] = 0x81;
    auVar11[0x11] = 0x81;
    auVar11[0x12] = 0x81;
    auVar11[0x13] = 0x81;
    auVar11[0x14] = 0x81;
    auVar11[0x15] = 0x81;
    auVar11[0x16] = 0x81;
    auVar11[0x17] = 0x81;
    auVar11[0x18] = 0x81;
    auVar11[0x19] = 0x81;
    auVar11[0x1a] = 0x81;
    auVar11[0x1b] = 0x81;
    auVar11[0x1c] = 0x81;
    auVar11[0x1d] = 0x81;
    auVar11[0x1e] = 0x81;
    auVar11[0x1f] = 0x81;
    auVar4 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    uVar8 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar9 = input + (ulong)uVar7 + (ulong)((uVar8 + (int)lVar5) * cols);
        lVar10 = 0;
        uVar6 = cols - uVar7;
        do {
          for (; uVar6 < 8; uVar6 = uVar6 + cols) {
            pfVar9 = pfVar9 + cols * 7;
          }
          local_48[lVar10] = pfVar9;
          pfVar9 = pfVar9 + 8;
          uVar6 = uVar6 - 8;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        auVar12._0_4_ = quant_mult * *local_48[0];
        auVar12._4_4_ = quant_mult * local_48[0][1];
        auVar12._8_4_ = quant_mult * local_48[0][2];
        auVar12._12_4_ = quant_mult * local_48[0][3];
        auVar12._16_4_ = quant_mult * local_48[0][4];
        auVar12._20_4_ = quant_mult * local_48[0][5];
        auVar12._28_36_ = in_ZMM3._28_36_;
        auVar12._24_4_ = quant_mult * local_48[0][6];
        auVar1 = vcvtps2dq_avx(auVar12._0_32_);
        auVar13._0_4_ = quant_mult * *local_48[1];
        auVar13._4_4_ = quant_mult * local_48[1][1];
        auVar13._8_4_ = quant_mult * local_48[1][2];
        auVar13._12_4_ = quant_mult * local_48[1][3];
        auVar13._16_4_ = quant_mult * local_48[1][4];
        auVar13._20_4_ = quant_mult * local_48[1][5];
        auVar13._28_36_ = in_ZMM4._28_36_;
        auVar13._24_4_ = quant_mult * local_48[1][6];
        auVar2 = vcvtps2dq_avx(auVar13._0_32_);
        auVar3 = vpackssdw_avx2(auVar1,auVar2);
        auVar1._4_4_ = quant_mult * local_48[2][1];
        auVar1._0_4_ = quant_mult * *local_48[2];
        auVar1._8_4_ = quant_mult * local_48[2][2];
        auVar1._12_4_ = quant_mult * local_48[2][3];
        auVar1._16_4_ = quant_mult * local_48[2][4];
        auVar1._20_4_ = quant_mult * local_48[2][5];
        auVar1._24_4_ = quant_mult * local_48[2][6];
        auVar1._28_4_ = auVar2._28_4_;
        auVar1 = vcvtps2dq_avx(auVar1);
        auVar14._0_4_ = quant_mult * *local_48[3];
        auVar14._4_4_ = quant_mult * local_48[3][1];
        auVar14._8_4_ = quant_mult * local_48[3][2];
        auVar14._12_4_ = quant_mult * local_48[3][3];
        auVar14._16_4_ = quant_mult * local_48[3][4];
        auVar14._20_4_ = quant_mult * local_48[3][5];
        auVar14._28_36_ = in_ZMM5._28_36_;
        auVar14._24_4_ = quant_mult * local_48[3][6];
        auVar2 = vcvtps2dq_avx(auVar14._0_32_);
        in_ZMM5 = ZEXT3264(auVar2);
        auVar1 = vpackssdw_avx2(auVar1,auVar2);
        in_ZMM4 = ZEXT3264(auVar1);
        auVar1 = vpacksswb_avx2(auVar3,auVar1);
        auVar1 = vpmaxsb_avx2(auVar1,auVar11);
        auVar1 = vpermd_avx2(auVar4,auVar1);
        in_ZMM3 = ZEXT3264(auVar1);
        *(undefined1 (*) [32])output = auVar1;
        output = (int8_t *)((long)output + 0x20);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      for (uVar7 = uVar7 + 0x20; cols <= uVar7; uVar7 = uVar7 - cols) {
        uVar8 = uVar8 + 8;
      }
    } while (uVar8 < rows);
  }
  return;
}

Assistant:

INTGEMM_AVX2 static void SelectColumnsB(const int8_t *input, int8_t *output, Index rows, const Index *cols_begin, const Index *cols_end) {
    AVX2::SelectColumnsOfB((const __m256i*)input, (__m256i*)output, rows, cols_begin, cols_end);
  }